

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface.cc
# Opt level: O0

void __thiscall rcg::Interface::~Interface(Interface *this)

{
  element_type *peVar1;
  element_type *this_00;
  int in_ESI;
  long in_RDI;
  vector<std::weak_ptr<rcg::Device>,_std::allocator<std::weak_ptr<rcg::Device>_>_> *unaff_retaddr;
  
  if (0 < *(int *)(in_RDI + 0x78)) {
    peVar1 = std::
             __shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x113097);
    (*peVar1->IFClose)(*(IF_HANDLE *)(in_RDI + 0x80));
    this_00 = std::__shared_ptr_access<rcg::System,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<rcg::System,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x1130bc);
    System::close(this_00,in_ESI);
  }
  std::vector<std::weak_ptr<rcg::Device>,_std::allocator<std::weak_ptr<rcg::Device>_>_>::~vector
            (unaff_retaddr);
  std::shared_ptr<GenApi_3_4::CNodeMapRef>::~shared_ptr
            ((shared_ptr<GenApi_3_4::CNodeMapRef> *)0x1130ea);
  std::shared_ptr<rcg::CPort>::~shared_ptr((shared_ptr<rcg::CPort> *)0x1130fb);
  std::__cxx11::string::~string((string *)(in_RDI + 0x30));
  std::shared_ptr<const_rcg::GenTLWrapper>::~shared_ptr
            ((shared_ptr<const_rcg::GenTLWrapper> *)0x113117);
  std::shared_ptr<rcg::System>::~shared_ptr((shared_ptr<rcg::System> *)0x113125);
  std::enable_shared_from_this<rcg::Interface>::~enable_shared_from_this
            ((enable_shared_from_this<rcg::Interface> *)0x11312f);
  return;
}

Assistant:

Interface::~Interface()
{
  if (n_open > 0)
  {
    gentl->IFClose(ifh);
    parent->close();
  }
}